

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O0

QPDFEFStreamObjectHelper * __thiscall
QPDFEFStreamObjectHelper::setModDate(QPDFEFStreamObjectHelper *this,string *date)

{
  QPDFObjectHandle local_60 [2];
  allocator<char> local_39;
  string local_38;
  string *local_18;
  string *date_local;
  QPDFEFStreamObjectHelper *this_local;
  
  local_18 = date;
  date_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"/ModDate",&local_39);
  QPDFObjectHandle::newString(local_60,local_18);
  setParam(this,&local_38,local_60);
  QPDFObjectHandle::~QPDFObjectHandle(local_60);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return this;
}

Assistant:

QPDFEFStreamObjectHelper&
QPDFEFStreamObjectHelper::setModDate(std::string const& date)
{
    setParam("/ModDate", QPDFObjectHandle::newString(date));
    return *this;
}